

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  HandlerResponse HVar4;
  uint uVar5;
  ostream *poVar6;
  ssize_t sVar7;
  long lVar8;
  ulong uVar9;
  byte in_DL;
  Response *in_RSI;
  long in_RDI;
  Server *in_R8;
  byte in_R9B;
  bool ret;
  string *data;
  BufferStream bstrm;
  char **in_stack_00000290;
  int *in_stack_00000298;
  char *in_stack_000002a0;
  Stream *in_stack_000002a8;
  stringstream ss;
  string boundary;
  string content_type;
  undefined7 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0f;
  Response *in_stack_fffffffffffffa10;
  Request *in_stack_fffffffffffffa18;
  undefined6 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa26;
  undefined1 in_stack_fffffffffffffa27;
  Response *in_stack_fffffffffffffa28;
  size_t in_stack_fffffffffffffa38;
  string *in_stack_fffffffffffffa40;
  Request *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7d;
  undefined1 uVar10;
  Server *res_00;
  Request *req_00;
  Stream *in_stack_fffffffffffffa90;
  Server *in_stack_fffffffffffffa98;
  byte local_552;
  bool local_523;
  bool local_522;
  bool local_4b1;
  bool local_4a1;
  BufferStream local_488;
  allocator<char> local_451;
  string local_450 [39];
  undefined1 local_429 [40];
  undefined1 local_401 [40];
  undefined8 local_3d9;
  allocator<char> local_3b1;
  string local_3b0 [39];
  allocator<char> local_389;
  string local_388 [39];
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [39];
  allocator<char> local_311;
  string local_310 [32];
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [32];
  stringstream local_2a8 [16];
  ostream local_298 [383];
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [16];
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff34;
  byte bVar11;
  undefined1 in_stack_ffffffffffffff35;
  byte bVar12;
  undefined1 in_stack_ffffffffffffff36;
  byte bVar13;
  allocator<char> in_stack_ffffffffffffff37;
  Request *in_stack_ffffffffffffff38;
  Server *in_stack_ffffffffffffff40;
  string local_a8 [48];
  string local_78 [32];
  string local_58 [39];
  byte local_31;
  Server *local_30;
  byte local_19;
  Response *local_18;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_31 = in_R9B & 1;
  local_30 = in_R8;
  local_18 = in_RSI;
  if (((399 < *(int *)&(in_R8->new_task_queue)._M_invoker) &&
      (bVar1 = std::function::operator_cast_to_bool
                         ((function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
                           *)0x1a65d3), bVar1)) &&
     (HVar4 = std::
              function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
              ::operator()((function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
                            *)CONCAT17(in_stack_fffffffffffffa27,
                                       CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)
                                      ),in_stack_fffffffffffffa18,in_stack_fffffffffffffa10),
     HVar4 == Handled)) {
    local_31 = 1;
  }
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string(local_78);
  if ((local_31 & 1) != 0) {
    apply_ranges(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 (Response *)
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,
                                   CONCAT15(in_stack_ffffffffffffff35,
                                            CONCAT14(in_stack_ffffffffffffff34,
                                                     in_stack_ffffffffffffff30)))),
                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  }
  bVar13 = 0;
  bVar12 = 0;
  bVar11 = 0;
  local_4b1 = true;
  if ((local_19 & 1) == 0) {
    std::allocator<char>::allocator();
    bVar13 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)in_stack_fffffffffffffa40);
    bVar12 = 1;
    Request::get_header_value
              (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    bVar11 = 1;
    local_4b1 = std::operator==(&in_stack_fffffffffffffa10->version,
                                (char *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08
                                                ));
  }
  if ((bVar11 & 1) != 0) {
    std::__cxx11::string::~string(local_a8);
  }
  if ((bVar12 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  }
  if ((bVar13 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  }
  if (local_4b1 == false) {
    std::__cxx11::stringstream::stringstream(local_2a8);
    poVar6 = std::operator<<(local_298,"timeout=");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(long *)(in_RDI + 0x38));
    poVar6 = std::operator<<(poVar6,", max=");
    std::ostream::operator<<(poVar6,*(ulong *)(in_RDI + 0x30));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)in_stack_fffffffffffffa40);
    std::__cxx11::stringstream::str();
    Response::set_header
              ((Response *)
               CONCAT17(in_stack_fffffffffffffa27,
                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
               &in_stack_fffffffffffffa18->method,&in_stack_fffffffffffffa10->version);
    std::__cxx11::string::~string(local_2f0);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    std::__cxx11::stringstream::~stringstream(local_2a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)in_stack_fffffffffffffa40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)in_stack_fffffffffffffa40);
    Response::set_header
              ((Response *)
               CONCAT17(in_stack_fffffffffffffa27,
                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
               &in_stack_fffffffffffffa18->method,&in_stack_fffffffffffffa10->version);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
             (allocator<char> *)in_stack_fffffffffffffa40);
  bVar1 = Response::has_header
                    ((Response *)
                     CONCAT17(in_stack_fffffffffffffa27,
                              CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                     &in_stack_fffffffffffffa18->method);
  local_522 = false;
  if (!bVar1) {
    bVar11 = std::__cxx11::string::empty();
    local_523 = true;
    if (((bVar11 & 1) != 0) &&
       (local_523 = true,
       (local_30->file_extension_and_mimetype_map_)._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_right == (_Base_ptr)0x0)) {
      local_523 = std::function::operator_cast_to_bool
                            ((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                             0x1a6c2c);
    }
    local_522 = local_523;
  }
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  if (local_522 != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)in_stack_fffffffffffffa40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)in_stack_fffffffffffffa40);
    Response::set_header
              ((Response *)
               CONCAT17(in_stack_fffffffffffffa27,
                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
               &in_stack_fffffffffffffa18->method,&in_stack_fffffffffffffa10->version);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator(&local_361);
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator(&local_339);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
             (allocator<char> *)in_stack_fffffffffffffa40);
  bVar1 = Response::has_header
                    ((Response *)
                     CONCAT17(in_stack_fffffffffffffa27,
                              CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                     &in_stack_fffffffffffffa18->method);
  local_552 = 0;
  if (!bVar1) {
    uVar5 = std::__cxx11::string::empty();
    local_552 = 0;
    if (((uVar5 & 1) != 0) &&
       (local_552 = 0,
       (local_30->file_extension_and_mimetype_map_)._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_right == (_Base_ptr)0x0)) {
      bVar1 = std::function::operator_cast_to_bool
                        ((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                         0x1a6ed3);
      local_552 = bVar1 ^ 0xff;
    }
  }
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator(&local_389);
  if ((local_552 & 1) != 0) {
    in_stack_fffffffffffffa98 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)in_stack_fffffffffffffa40);
    in_stack_fffffffffffffa90 = (Stream *)&local_3d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)in_stack_fffffffffffffa40);
    Response::set_header
              ((Response *)
               CONCAT17(in_stack_fffffffffffffa27,
                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
               &in_stack_fffffffffffffa18->method,&in_stack_fffffffffffffa10->version);
    std::__cxx11::string::~string((string *)((long)&local_3d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    std::__cxx11::string::~string(local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
  }
  req_00 = (Request *)local_401;
  res_00 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
             (allocator<char> *)in_stack_fffffffffffffa40);
  uVar2 = Response::has_header
                    ((Response *)
                     CONCAT17(in_stack_fffffffffffffa27,
                              CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                     &in_stack_fffffffffffffa18->method);
  bVar11 = false;
  if (!(bool)uVar2) {
    in_stack_fffffffffffffa7d =
         std::operator==(&in_stack_fffffffffffffa10->version,
                         (char *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
    bVar11 = in_stack_fffffffffffffa7d;
  }
  uVar10 = bVar11;
  std::__cxx11::string::~string((string *)(local_401 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_401);
  if ((bVar11 & 1) != 0) {
    in_stack_fffffffffffffa70 = (string *)local_429;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)in_stack_fffffffffffffa40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)in_stack_fffffffffffffa40);
    Response::set_header
              ((Response *)
               CONCAT17(in_stack_fffffffffffffa27,
                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
               &in_stack_fffffffffffffa18->method,&in_stack_fffffffffffffa10->version);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator(&local_451);
    std::__cxx11::string::~string((string *)(local_429 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_429);
  }
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_httplib::Request_&,_httplib::Response_&)> *)0x1a72f2);
  if (bVar1) {
    std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
              ((function<void_(const_httplib::Request_&,_httplib::Response_&)> *)
               CONCAT17(in_stack_fffffffffffffa27,
                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
               in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  }
  detail::BufferStream::BufferStream((BufferStream *)in_stack_fffffffffffffa10);
  status_message(*(int *)&(local_30->new_task_queue)._M_invoker);
  sVar7 = Stream::write_format<int,char_const*>
                    (in_stack_000002a8,in_stack_000002a0,in_stack_00000298,in_stack_00000290);
  if (sVar7 == 0) {
    local_1 = 0;
    bVar1 = true;
  }
  else {
    lVar8 = std::
            function<long_(httplib::Stream_&,_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
            ::operator()((function<long_(httplib::Stream_&,_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
                          *)CONCAT17(in_stack_fffffffffffffa27,
                                     CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                         (Stream *)in_stack_fffffffffffffa18,
                         (multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffa10);
    if (lVar8 == 0) {
      local_1 = 0;
      bVar1 = true;
    }
    else {
      detail::BufferStream::get_buffer_abi_cxx11_(&local_488);
      in_stack_fffffffffffffa28 = local_18;
      std::__cxx11::string::data();
      std::__cxx11::string::size();
      detail::write_data((Stream *)in_stack_fffffffffffffa28,
                         (char *)CONCAT17(in_stack_fffffffffffffa27,
                                          CONCAT16(in_stack_fffffffffffffa26,
                                                   in_stack_fffffffffffffa20)),
                         (size_t)in_stack_fffffffffffffa18);
      bVar1 = false;
    }
  }
  detail::BufferStream::~BufferStream((BufferStream *)in_stack_fffffffffffffa10);
  if (!bVar1) {
    local_4a1 = true;
    uVar3 = std::operator!=(&in_stack_fffffffffffffa10->version,
                            (char *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
    if ((bool)uVar3) {
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        in_stack_fffffffffffffa18 = (Request *)std::__cxx11::string::data();
        std::__cxx11::string::size();
        in_stack_fffffffffffffa26 =
             detail::write_data((Stream *)in_stack_fffffffffffffa28,
                                (char *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffa26,
                                                                in_stack_fffffffffffffa20)),
                                (size_t)in_stack_fffffffffffffa18);
        in_stack_fffffffffffffa10 = local_18;
        local_4a1 = (bool)in_stack_fffffffffffffa26;
      }
      else {
        bVar1 = std::function::operator_cast_to_bool
                          ((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                           0x1a756b);
        if (bVar1) {
          local_4a1 = write_content_with_provider
                                (in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,req_00,
                                 (Response *)res_00,
                                 (string *)
                                 CONCAT17(uVar2,CONCAT16(uVar10,CONCAT15(in_stack_fffffffffffffa7d,
                                                                         CONCAT14(bVar11,
                                                  in_stack_fffffffffffffa78)))),
                                 in_stack_fffffffffffffa70);
          if (local_4a1) {
            *(undefined1 *)((long)&(local_30->file_request_handler_)._M_invoker + 1) = 1;
          }
          else {
            *(undefined1 *)((long)&(local_30->file_request_handler_)._M_invoker + 1) = 0;
          }
        }
      }
    }
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(const_httplib::Request_&,_const_httplib::Response_&)> *)
                       0x1a75f8);
    if (bVar1) {
      std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
                ((function<void_(const_httplib::Request_&,_const_httplib::Response_&)> *)
                 CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                 in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    }
    local_1 = local_4a1;
  }
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::stringstream ss;
    ss << "timeout=" << keep_alive_timeout_sec_
       << ", max=" << keep_alive_max_count_;
    res.set_header("Keep-Alive", ss.str());
  }

  if (!res.has_header("Content-Type") &&
      (!res.body.empty() || res.content_length_ > 0 || res.content_provider_)) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Content-Length") && res.body.empty() &&
      !res.content_length_ && !res.content_provider_) {
    res.set_header("Content-Length", "0");
  }

  if (!res.has_header("Accept-Ranges") && req.method == "HEAD") {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;

    if (!bstrm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                            status_message(res.status))) {
      return false;
    }

    if (!header_writer_(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    detail::write_data(strm, data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!detail::write_data(strm, res.body.data(), res.body.size())) {
        ret = false;
      }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        res.content_provider_success_ = false;
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}